

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<void_*>::dispose(ArrayBuilder<void_*> *this)

{
  void **firstElement;
  RemoveConst<void_*> *ppvVar1;
  void **ppvVar2;
  void **endCopy;
  void **posCopy;
  void **ptrCopy;
  ArrayBuilder<void_*> *this_local;
  
  firstElement = this->ptr;
  ppvVar1 = this->pos;
  ppvVar2 = this->endPtr;
  if (firstElement != (void **)0x0) {
    this->ptr = (void **)0x0;
    this->pos = (RemoveConst<void_*> *)0x0;
    this->endPtr = (void **)0x0;
    ArrayDisposer::dispose<void*>
              (this->disposer,firstElement,(long)ppvVar1 - (long)firstElement >> 3,
               (long)ppvVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }